

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

QMimeData * __thiscall QTreeModel::mimeData(QTreeModel *this,QModelIndexList *indexes)

{
  long lVar1;
  QTreeWidgetItem *pQVar2;
  iterator iVar3;
  iterator iVar4;
  ulong uVar5;
  QTreeWidgetItem **ppQVar6;
  long *plVar7;
  QMimeData *pQVar8;
  QTreeWidgetItem *pQVar9;
  QTreeWidgetItem **ppQVar10;
  QModelIndex *pQVar11;
  QTreeWidgetItem **ppQVar12;
  QModelIndex *pQVar13;
  long in_FS_OFFSET;
  QList<QTreeWidgetItem_*> local_58;
  QTreeWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (QTreeWidgetItem **)0x0;
  local_58.d.size = 0;
  lVar1 = (indexes->d).size;
  if (lVar1 != 0) {
    pQVar13 = (indexes->d).ptr;
    pQVar11 = pQVar13 + lVar1;
    do {
      local_40 = (QTreeWidgetItem *)(pQVar13->m).ptr;
      if (local_40 != (QTreeWidgetItem *)0x0) {
        local_40 = (QTreeWidgetItem *)pQVar13->i;
      }
      if ((pQVar13->c | pQVar13->r) < 0) {
        local_40 = (QTreeWidgetItem *)0x0;
      }
      QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,local_58.d.size,&local_40);
      QList<QTreeWidgetItem_*>::end(&local_58);
      pQVar13 = pQVar13 + 1;
    } while (pQVar13 != pQVar11);
  }
  iVar3 = QList<QTreeWidgetItem_*>::begin(&local_58);
  iVar4 = QList<QTreeWidgetItem_*>::end(&local_58);
  if (iVar3.i != iVar4.i) {
    uVar5 = (long)iVar4.i - (long)iVar3.i >> 3;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QTreeWidgetItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar3.i,iVar4.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QTreeWidgetItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar3.i,iVar4.i);
  }
  iVar3 = QList<QTreeWidgetItem_*>::begin(&local_58);
  iVar4 = QList<QTreeWidgetItem_*>::end(&local_58);
  if (iVar3.i != iVar4.i) {
    ppQVar10 = iVar3.i + 1;
    do {
      ppQVar12 = ppQVar10;
      if (ppQVar12 == iVar4.i) goto LAB_005ae8f5;
      ppQVar10 = ppQVar12 + 1;
    } while (ppQVar12[-1] != *ppQVar12);
    ppQVar6 = ppQVar12 + -1;
    pQVar9 = ppQVar12[-1];
    for (; ppQVar10 != iVar4.i; ppQVar10 = ppQVar10 + 1) {
      pQVar2 = *ppQVar10;
      if (pQVar9 != pQVar2) {
        ppQVar6[1] = pQVar2;
        ppQVar6 = ppQVar6 + 1;
      }
      pQVar9 = pQVar2;
    }
    iVar4.i = ppQVar6 + 1;
  }
LAB_005ae8f5:
  iVar3 = QList<QTreeWidgetItem_*>::end(&local_58);
  QList<QTreeWidgetItem_*>::erase(&local_58,(const_iterator)iVar4.i,(const_iterator)iVar3.i);
  QArrayDataPointer<QModelIndex>::operator=(&(this->cachedIndexes).d,&indexes->d);
  plVar7 = (long *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
  pQVar8 = (QMimeData *)(**(code **)(*plVar7 + 0x318))(plVar7,&local_58);
  QList<QModelIndex>::clear(&this->cachedIndexes);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar8;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTreeModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QTreeWidgetItem *> items;
    std::transform(indexes.begin(), indexes.end(), std::back_inserter(items),
                   [this](const QModelIndex &idx) -> QTreeWidgetItem * { return item(idx); });

    // Ensure we only have one item as an item may have more than
    // one index selected if there is more than one column
    std::sort(items.begin(), items.end());
    items.erase(std::unique(items.begin(), items.end()), items.end());

    // cachedIndexes is a little hack to avoid copying from QModelIndexList to
    // QList<QTreeWidgetItem*> and back again in the view
    cachedIndexes = indexes;
    QMimeData *mimeData = view()->mimeData(items);
    cachedIndexes.clear();
    return mimeData;
}